

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_stat(char *_fname,PHYSFS_Stat *stat)

{
  DirHandle *h;
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  char *in_RAX;
  size_t sVar6;
  long *plVar7;
  long lVar8;
  ErrState *pEVar9;
  char **ppcVar10;
  __PHYSFS_DIRHANDLE__ *h_00;
  void **retval;
  char *dst;
  char *local_38;
  char *arcfname;
  
  ppcVar10 = &local_38;
  if ((_fname == (char *)0x0) || (stat == (PHYSFS_Stat *)0x0)) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
LAB_001092f6:
    iVar5 = 0;
  }
  else {
    *(undefined4 *)&stat->createtime = 0xffffffff;
    *(undefined4 *)((long)&stat->createtime + 4) = 0xffffffff;
    *(undefined4 *)&stat->accesstime = 0xffffffff;
    *(undefined4 *)((long)&stat->accesstime + 4) = 0xffffffff;
    *(undefined4 *)&stat->filesize = 0xffffffff;
    *(undefined4 *)((long)&stat->filesize + 4) = 0xffffffff;
    *(undefined4 *)&stat->modtime = 0xffffffff;
    *(undefined4 *)((long)&stat->modtime + 4) = 0xffffffff;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;
    local_38 = in_RAX;
    __PHYSFS_platformGrabMutex(stateLock);
    sVar6 = strlen(_fname);
    if (sVar6 + longest_root + 1 < 0x100) {
      ppcVar10 = (char **)((long)&local_38 - (longest_root + sVar6 + 0x18 & 0xfffffffffffffff0));
      lVar8 = 0;
      plVar7 = (long *)ppcVar10;
    }
    else {
      plVar7 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(longest_root + sVar6 + 9);
      if (plVar7 == (long *)0x0) {
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        __PHYSFS_platformReleaseMutex(stateLock);
        goto LAB_001092f6;
      }
      lVar8 = 1;
    }
    *plVar7 = lVar8;
    dst = (char *)((long)plVar7 + longest_root + 8);
    ((long *)ppcVar10)[-1] = 0x109336;
    iVar4 = sanitizePlatformIndependentPath(_fname,dst);
    iVar5 = 0;
    if (iVar4 != 0) {
      if (*dst == '\0') {
        stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
        stat->readonly = (uint)(writeDir == (DirHandle *)0x0);
LAB_001093fe:
        iVar5 = 1;
      }
      else {
        h_00 = searchPath;
        iVar5 = 0;
        if (searchPath != (DirHandle *)0x0) {
          do {
            h = (DirHandle *)h_00->mountPoint;
            local_38 = dst;
            ((long *)ppcVar10)[-1] = 0x109367;
            iVar5 = partOfMountPoint(h,dst);
            if (iVar5 != 0) {
              stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
              stat->readonly = 1;
              goto LAB_001093fe;
            }
            ((long *)ppcVar10)[-1] = 0x10937d;
            iVar5 = verifyPath(h_00,&local_38,0);
            pcVar3 = local_38;
            if (iVar5 != 0) {
              pvVar1 = h_00->opaque;
              p_Var2 = h_00->funcs->stat;
              ((long *)ppcVar10)[-1] = 0x109393;
              iVar5 = (*p_Var2)(pvVar1,pcVar3,stat);
              if (iVar5 != 0) goto LAB_00109404;
              ((long *)ppcVar10)[-1] = 0x1093a0;
              pEVar9 = findErrorForCurrentThread();
              iVar5 = 0;
              if ((pEVar9 == (ErrState *)0x0) || (pEVar9->code != PHYSFS_ERR_NOT_FOUND))
              goto LAB_00109404;
            }
            h_00 = h_00->next;
          } while (h_00 != (__PHYSFS_DIRHANDLE__ *)0x0);
          iVar5 = 0;
        }
      }
    }
LAB_00109404:
    ((long *)ppcVar10)[-1] = 0x109410;
    __PHYSFS_platformReleaseMutex(stateLock);
    if (*plVar7 != 0) {
      ((long *)ppcVar10)[-1] = 0x10941f;
      (*__PHYSFS_AllocatorHooks.Free)(plVar7);
    }
  }
  return iVar5;
}

Assistant:

int PHYSFS_stat(const char *_fname, PHYSFS_Stat *stat)
{
    int retval = 0;
    char *allocated_fname;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!stat, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    /* set some sane defaults... */
    stat->filesize = -1;
    stat->modtime = -1;
    stat->createtime = -1;
    stat->accesstime = -1;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;

    __PHYSFS_platformGrabMutex(stateLock);
    len = strlen(_fname) + longest_root + 1;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        if (*fname == '\0')
        {
            stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
            stat->readonly = !writeDir; /* Writeable if we have a writeDir */
            retval = 1;
        } /* if */
        else
        {
            DirHandle *i;
            int exists = 0;
            for (i = searchPath; ((i != NULL) && (!exists)); i = i->next)
            {
                char *arcfname = fname;
                exists = partOfMountPoint(i, arcfname);
                if (exists)
                {
                    stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
                    stat->readonly = 1;
                    retval = 1;
                } /* if */
                else if (verifyPath(i, &arcfname, 0))
                {
                    retval = i->funcs->stat(i->opaque, arcfname, stat);
                    if ((retval) || (currentErrorCode() != PHYSFS_ERR_NOT_FOUND))
                        exists = 1;
                } /* else if */
            } /* for */
        } /* else */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);

    return retval;
}